

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

bool __thiscall
i2p::sam::Session::Connect(Session *this,CService *to,Connection *conn,bool *proxy_error)

{
  long lVar1;
  _Head_base<0UL,_Sock_*,_false> _Var2;
  _Head_base<0UL,_Sock_*,_false> sock;
  bool bVar3;
  uint16_t uVar4;
  runtime_error *prVar5;
  char *args;
  string *request;
  CService *pCVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  allocator<char> local_1b0 [8];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  string local_188;
  undefined1 local_168 [120];
  string local_f0;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  string session_id;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = to;
  uVar4 = CService::GetPort(to);
  if (uVar4 == 0) {
    *proxy_error = true;
    session_id._M_dataplus._M_p = (pointer)&session_id.field_2;
    session_id._M_string_length = 0;
    session_id.field_2._M_local_buf[0] = '\0';
    CService::operator=(&conn->peer,to);
    args = "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
    ;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock10,&this->m_mutex,"m_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
               ,0xef,false);
    CreateIfNotCreatedAlready(this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&session_id,&this->m_session_id);
    CService::operator=(&conn->me,&this->m_my_addr);
    Hello((Session *)local_168);
    sock._M_head_impl._2_6_ = local_168._2_6_;
    sock._M_head_impl._0_2_ = local_168._0_2_;
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock10.super_unique_lock);
    CNetAddr::ToStringAddr_abi_cxx11_((string *)(local_168 + 0x78),&to->super_CNetAddr);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_168,(tinyformat *)"NAMING LOOKUP NAME=%s",local_168 + 0x78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
    SendRequestAndGetReply
              ((Reply *)&criticalblock10,this,sock._M_head_impl,(string *)local_168,true);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)(local_168 + 0x78));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,"VALUE",(allocator<char> *)&local_188);
    Reply::Get((string *)(local_168 + 0x78),(Reply *)&criticalblock10,(string *)local_168);
    std::__cxx11::string::~string((string *)local_168);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_188,(tinyformat *)"STREAM CONNECT ID=%s DESTINATION=%s SILENT=false",
               (char *)&session_id,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_168 + 0x78),args_1);
    request = &local_188;
    SendRequestAndGetReply((Reply *)local_168,this,sock._M_head_impl,request,false);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock11,"RESULT",local_1b0);
    Reply::Get(&local_188,(Reply *)local_168,(string *)&criticalblock11);
    std::__cxx11::string::~string((string *)&criticalblock11);
    bVar3 = std::operator==(&local_188,"OK");
    if (!bVar3) {
      bVar3 = std::operator==(&local_188,"INVALID_ID");
      if (bVar3) {
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  (&criticalblock11,&this->m_mutex,"m_mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
                   ,0x107,false);
        Disconnect(this);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Invalid session id");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_003caf45;
      }
      bVar3 = std::operator==(&local_188,"CANT_REACH_PEER");
      if (bVar3) {
LAB_003cad56:
        *proxy_error = false;
      }
      else {
        bVar3 = std::operator==(&local_188,"TIMEOUT");
        if (bVar3) goto LAB_003cad56;
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                ((string *)&criticalblock11,(tinyformat *)0x6ce10c,local_168,request);
      std::runtime_error::runtime_error(prVar5,(string *)&criticalblock11);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_003caf45;
    }
    _Var2._M_head_impl =
         (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
    _M_head_impl = sock._M_head_impl;
    if (_Var2._M_head_impl != (Sock *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_Sock + 8))();
    }
    std::__cxx11::string::~string((string *)&local_188);
    Reply::~Reply((Reply *)local_168);
    std::__cxx11::string::~string((string *)(local_168 + 0x78));
    Reply::~Reply((Reply *)&criticalblock10);
    bVar3 = true;
    std::__cxx11::string::~string((string *)&session_id);
  }
  else {
    bVar3 = ::LogAcceptCategory(NET,(Level)pCVar6);
    if (bVar3) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&criticalblock10,to);
      local_168._0_2_ = CService::GetPort(to);
      logging_function._M_str = "Connect";
      logging_function._M_len = 7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<std::__cxx11::string,unsigned_short>
                (logging_function,source_file,0xe2,I2P,Debug,(ConstevalFormatString<2U>)0x6cdfbb,
                 (string *)&criticalblock10,(unsigned_short *)local_168);
      std::__cxx11::string::~string((string *)&criticalblock10);
    }
    *proxy_error = false;
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
LAB_003caf45:
  __stack_chk_fail();
}

Assistant:

bool Session::Connect(const CService& to, Connection& conn, bool& proxy_error)
{
    // Refuse connecting to arbitrary ports. We don't specify any destination port to the SAM proxy
    // when connecting (SAM 3.1 does not use ports) and it forces/defaults it to I2P_SAM31_PORT.
    if (to.GetPort() != I2P_SAM31_PORT) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error connecting to %s, connection refused due to arbitrary port %s\n", to.ToStringAddrPort(), to.GetPort());
        proxy_error = false;
        return false;
    }

    proxy_error = true;

    std::string session_id;
    std::unique_ptr<Sock> sock;
    conn.peer = to;

    try {
        {
            LOCK(m_mutex);
            CreateIfNotCreatedAlready();
            session_id = m_session_id;
            conn.me = m_my_addr;
            sock = Hello();
        }

        const Reply& lookup_reply =
            SendRequestAndGetReply(*sock, strprintf("NAMING LOOKUP NAME=%s", to.ToStringAddr()));

        const std::string& dest = lookup_reply.Get("VALUE");

        const Reply& connect_reply = SendRequestAndGetReply(
            *sock, strprintf("STREAM CONNECT ID=%s DESTINATION=%s SILENT=false", session_id, dest),
            false);

        const std::string& result = connect_reply.Get("RESULT");

        if (result == "OK") {
            conn.sock = std::move(sock);
            return true;
        }

        if (result == "INVALID_ID") {
            LOCK(m_mutex);
            Disconnect();
            throw std::runtime_error("Invalid session id");
        }

        if (result == "CANT_REACH_PEER" || result == "TIMEOUT") {
            proxy_error = false;
        }

        throw std::runtime_error(strprintf("\"%s\"", connect_reply.full));
    } catch (const std::runtime_error& e) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error connecting to %s: %s\n", to.ToStringAddrPort(), e.what());
        CheckControlSock();
        return false;
    }
}